

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

axbStatus_t initMatSparseRandom(axbMat_s *A,size_t nonzeros_per_row)

{
  axbStatus_t aVar1;
  int iVar2;
  size_t num_values;
  undefined4 *row_markers;
  void *col_indices;
  void *values;
  ulong uVar3;
  ulong uStack_78;
  int err_check_12388123_1;
  size_t j;
  size_t i;
  size_t col_inc;
  int nnz_index;
  double *host_vals;
  int *host_cols;
  int *host_rows;
  size_t nonzeros;
  int err_check_12388123;
  size_t cols;
  size_t rows;
  size_t nonzeros_per_row_local;
  axbMat_s *A_local;
  
  rows = nonzeros_per_row;
  nonzeros_per_row_local = (size_t)A;
  aVar1 = axbMatGetSizes(A,&cols,(size_t *)&stack0xffffffffffffffd0);
  if (aVar1 == 0) {
    num_values = cols * rows;
    printf("initMatSparseRandom(): Initializing sparse matrix with %ld rows and %ld nonzeros\n",cols
           ,num_values);
    row_markers = (undefined4 *)malloc((cols + 1) * 4);
    col_indices = malloc(num_values * 4);
    values = malloc(num_values * 8);
    *row_markers = 0;
    col_inc._4_4_ = 0;
    uVar3 = cols / rows >> 1;
    for (j = 0; j < cols; j = j + 1) {
      for (uStack_78 = 0; uStack_78 < rows; uStack_78 = uStack_78 + 1) {
        iVar2 = rand();
        *(int *)((long)col_indices + (long)col_inc._4_4_ * 4) =
             (int)(j >> 1) + (int)uVar3 * (int)uStack_78 + (int)((ulong)(long)iVar2 % uVar3);
        iVar2 = rand();
        *(double *)((long)values + (long)col_inc._4_4_ * 8) =
             ((double)(iVar2 % 0x3ff) - 500.0) / 300.0 + 1.0;
        col_inc._4_4_ = col_inc._4_4_ + 1;
      }
      row_markers[j + 1] = col_inc._4_4_;
    }
    aVar1 = axbMatSetValuesCSR((axbMat_s *)nonzeros_per_row_local,row_markers,AXB_INT_32,col_indices
                               ,AXB_INT_32,values,AXB_REAL_DOUBLE,num_values);
    if (aVar1 == 0) {
      free(row_markers);
      free(col_indices);
      free(values);
      A_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Failure in line %d in file %s\n",0xa8,
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
             );
      A_local._4_4_ = aVar1;
    }
  }
  else {
    fprintf(_stderr,"Failure in line %d in file %s\n",0x91,
            "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
           );
    A_local._4_4_ = aVar1;
  }
  return A_local._4_4_;
}

Assistant:

axbStatus_t initMatSparseRandom(struct axbMat_s *A, size_t nonzeros_per_row)
{
  size_t rows, cols;
  AXB_ERR_CHECK(axbMatGetSizes(A, &rows, &cols));
  size_t nonzeros = rows * nonzeros_per_row;

  printf("initMatSparseRandom(): Initializing sparse matrix with %ld rows and %ld nonzeros\n", rows, nonzeros);

  int    *host_rows = malloc(sizeof(int)   *(rows+1));
  int    *host_cols = malloc(sizeof(int)   *(nonzeros));
  double *host_vals = malloc(sizeof(double)*(nonzeros));

  // populate
  host_rows[0] = 0;
  int nnz_index = 0;
  size_t col_inc = rows / nonzeros_per_row / 2;
  for (size_t i=0; i<rows; ++i) {
    for (size_t j=0; j<nonzeros_per_row; ++j) {
      host_cols[nnz_index] = i/2 + col_inc * j + rand() % col_inc;
      host_vals[nnz_index] = 1.0 + (rand() % 1023 - 500.0) / 300.0;
      ++nnz_index;
    }
    host_rows[i+1] = nnz_index;
  }

  // copy over to matrix:
  AXB_ERR_CHECK(axbMatSetValuesCSR(A, host_rows, AXB_INT_32, host_cols, AXB_INT_32, host_vals, AXB_REAL_DOUBLE, nonzeros));

  free(host_rows);
  free(host_cols);
  free(host_vals);
  return 0;
}